

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

Vec_Ptr_t * collectUserGivenDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  void **__ptr;
  Vec_Ptr_t *pVVar5;
  int i;
  uint uVar6;
  
  pVVar2 = Vec_PtrAlloc((int)pNtk);
  for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
    pObj = Abc_NtkPo(pNtk,i);
    pcVar3 = Abc_ObjName(pObj);
    pcVar3 = strstr(pcVar3,"csLevel1Stabil_");
    if (pcVar3 != (char *)0x0) {
      pVVar4 = createSingletonIntVector(i);
      iVar1 = pVVar2->nSize;
      if (iVar1 == pVVar2->nCap) {
        uVar6 = iVar1 * 2;
        if (iVar1 < 0x10) {
          uVar6 = 0x10;
        }
        __ptr = pVVar2->pArray;
        if (iVar1 < (int)uVar6) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar6 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar6 << 3);
          }
          pVVar2->pArray = __ptr;
          pVVar2->nCap = uVar6;
        }
      }
      else {
        __ptr = pVVar2->pArray;
      }
      pVVar2->nSize = iVar1 + 1;
      __ptr[iVar1] = pVVar4;
    }
  }
  pVVar5 = (Vec_Ptr_t *)0x0;
  if (0 < pVVar2->nSize) {
    pVVar5 = pVVar2;
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t *collectUserGivenDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
	Abc_Obj_t *pObj;
	int i;
	Vec_Ptr_t *monotoneVector;
	Vec_Int_t *newIntVector;

	monotoneVector = Vec_PtrAlloc(0);	
	Abc_NtkForEachPo( pNtk, pObj, i )
	{
		if( strstr( Abc_ObjName( pObj ), "csLevel1Stabil_" ) != NULL )
		{
			newIntVector = createSingletonIntVector(i);
			Vec_PtrPush(monotoneVector, newIntVector);
		}
	}

	if( Vec_PtrSize(monotoneVector) > 0 )
		return monotoneVector;
	else
		return NULL;

}